

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,Int value)

{
  char *pcVar1;
  char **ppcVar2;
  allocator local_42;
  byte local_41;
  char **ppcStack_40;
  bool isNegative;
  char *current;
  char buffer [32];
  Int value_local;
  
  buffer._28_4_ = SUB84(this,0);
  ppcStack_40 = (char **)(buffer + 0x18);
  local_41 = (int)buffer._28_4_ < 0;
  if ((bool)local_41) {
    buffer._28_4_ = -buffer._28_4_;
  }
  uintToString(buffer._28_4_,(char **)&stack0xffffffffffffffc0);
  if ((local_41 & 1) != 0) {
    pcVar1 = (char *)((long)ppcStack_40 + -1);
    ppcStack_40 = (char **)((long)ppcStack_40 + -1);
    *pcVar1 = '-';
  }
  ppcVar2 = ppcStack_40;
  if (&current <= ppcStack_40) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)ppcVar2,&local_42);
    std::allocator<char>::~allocator((allocator<char> *)&local_42);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_writer.cpp"
                ,0x49,"std::string Json::valueToString(Int)");
}

Assistant:

std::string valueToString ( Int value )
{
    char buffer[32];
    char* current = buffer + sizeof (buffer);
    bool isNegative = value < 0;

    if ( isNegative )
        value = -value;

    uintToString ( UInt (value), current );

    if ( isNegative )
        *--current = '-';

    assert ( current >= buffer );
    return current;
}